

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O3

void __thiscall
vkt::texture::anon_unknown_0::Texture3DLodControlTestInstance::Texture3DLodControlTestInstance
          (Texture3DLodControlTestInstance *this,Context *context,
          Texture3DMipmapTestCaseParameters *testParameters)

{
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *this_00;
  deInt32 *pdVar1;
  char *pcVar2;
  Precision PVar3;
  FilterMode FVar4;
  FilterMode FVar5;
  FilterMode FVar6;
  WrapMode WVar7;
  WrapMode WVar8;
  VkFormat VVar9;
  undefined4 uVar10;
  SharedPtrStateBase *pSVar11;
  TestTexture3D *pTVar12;
  SharedPtrStateBase *pSVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  deInt32 *pdVar19;
  Vector<float,_4> res;
  TextureFormatInfo fmtInfo;
  RGBA local_cc;
  TextureRenderer *local_c8;
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  Vec4 local_a8;
  PixelBufferAccess local_98;
  TextureFormatInfo local_70;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Texture3DLodControlTestInstance_00d03ad8;
  this->m_texWidth = 0x20;
  this->m_texHeight = 0x20;
  this->m_texDepth = 0x20;
  PVar3 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.texCoordPrecision;
  FVar4 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.minFilter;
  FVar5 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.magFilter;
  FVar6 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.magFilter;
  WVar7 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.wrapS;
  WVar8 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.wrapT;
  VVar9 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.format;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.sampleCount =
       (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
       super_TextureCommonTestCaseParameters.sampleCount;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.texCoordPrecision = PVar3;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.minFilter = FVar4;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.magFilter = FVar5;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.magFilter = FVar6;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.wrapS = WVar7;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.wrapT = WVar8;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.format = VVar9;
  this_00 = &(this->m_testParameters).super_Texture3DTestCaseParameters.
             super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.programs;
  std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::vector
            (this_00,&(testParameters->super_Texture3DTestCaseParameters).
                      super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
                      programs);
  iVar18 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
           height;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.width
       = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.width
  ;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  height = iVar18;
  iVar18 = (testParameters->super_Texture3DTestCaseParameters).depth;
  (this->m_testParameters).super_Texture3DTestCaseParameters.wrapR =
       (testParameters->super_Texture3DTestCaseParameters).wrapR;
  (this->m_testParameters).super_Texture3DTestCaseParameters.depth = iVar18;
  uVar10 = *(undefined4 *)&(testParameters->super_TextureMipmapCommonTestCaseParameters).field_0x4;
  pcVar2 = (testParameters->super_TextureMipmapCommonTestCaseParameters).minFilterName;
  (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType =
       (testParameters->super_TextureMipmapCommonTestCaseParameters).coordType;
  *(undefined4 *)&(this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.field_0x4 =
       uVar10;
  (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.minFilterName = pcVar2;
  this->m_minFilter =
       (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
       super_TextureCommonTestCaseParameters.minFilter;
  (this->m_texture).m_ptr = (TestTexture3D *)0x0;
  (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
  local_c0 = this_00;
  pSVar11 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar11->strongRefCount = 0;
  pSVar11->weakRefCount = 0;
  pSVar11->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d030a0;
  pSVar11[1]._vptr_SharedPtrStateBase = (_func_int **)0x0;
  (this->m_texture).m_state = pSVar11;
  pSVar11->strongRefCount = 1;
  pSVar11->weakRefCount = 1;
  local_c8 = &this->m_renderer;
  util::TextureRenderer::TextureRenderer
            (local_c8,context,
             (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
             super_TextureCommonTestCaseParameters.sampleCount,this->m_texWidth << 2,
             this->m_texHeight << 2);
  local_98.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatInfo(&local_70,(TextureFormat *)&local_98);
  uVar15 = this->m_texHeight;
  if (this->m_texHeight < this->m_texWidth) {
    uVar15 = this->m_texWidth;
  }
  if ((int)uVar15 <= this->m_texDepth) {
    uVar15 = this->m_texDepth;
  }
  if (uVar15 == 0) {
    uVar17 = 0x20;
  }
  else {
    uVar17 = 0x1f;
    if (uVar15 != 0) {
      for (; uVar15 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    uVar17 = uVar17 ^ 0x1f;
  }
  pTVar12 = (TestTexture3D *)operator_new(0x78);
  local_98.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  pipeline::TestTexture3D::TestTexture3D
            (pTVar12,(TextureFormat *)&local_98,this->m_texWidth,this->m_texHeight,this->m_texDepth)
  ;
  pSVar13 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar1 = &pSVar13->strongRefCount;
  pSVar13->strongRefCount = 0;
  pSVar13->weakRefCount = 0;
  pSVar13->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d030a0;
  pSVar13[1]._vptr_SharedPtrStateBase = (_func_int **)pTVar12;
  pSVar13->strongRefCount = 1;
  pSVar13->weakRefCount = 1;
  pSVar11 = (this->m_texture).m_state;
  if (pSVar11 != pSVar13) {
    if (pSVar11 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar19 = &pSVar11->strongRefCount;
      *pdVar19 = *pdVar19 + -1;
      UNLOCK();
      if (*pdVar19 == 0) {
        (this->m_texture).m_ptr = (TestTexture3D *)0x0;
        (*((this->m_texture).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar19 = &((this->m_texture).m_state)->weakRefCount;
      *pdVar19 = *pdVar19 + -1;
      UNLOCK();
      if (*pdVar19 == 0) {
        pSVar11 = (this->m_texture).m_state;
        if (pSVar11 != (SharedPtrStateBase *)0x0) {
          (*pSVar11->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_texture).m_ptr = pTVar12;
    (this->m_texture).m_state = pSVar13;
    LOCK();
    pSVar13->strongRefCount = pSVar13->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar19 = &((this->m_texture).m_state)->weakRefCount;
    *pdVar19 = *pdVar19 + 1;
    UNLOCK();
  }
  pdVar19 = &pSVar13->weakRefCount;
  LOCK();
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar13->_vptr_SharedPtrStateBase[2])(pSVar13);
  }
  LOCK();
  *pdVar19 = *pdVar19 + -1;
  UNLOCK();
  if (*pdVar19 == 0) {
    (*pSVar13->_vptr_SharedPtrStateBase[1])(pSVar13);
  }
  if (uVar15 != 0) {
    iVar14 = 0x1f - uVar17;
    uVar16 = 0;
    iVar18 = 0;
    if (0 < iVar14) {
      iVar18 = iVar14;
    }
    do {
      pTVar12 = (this->m_texture).m_ptr;
      (*(pTVar12->super_TestTexture)._vptr_TestTexture[7])(&local_98,pTVar12,uVar16,0);
      uVar17 = (int)(0xff / (long)iVar14) * (int)uVar16;
      uVar15 = uVar17;
      if (0xfe < uVar17) {
        uVar15 = 0xff;
      }
      local_cc.m_value = uVar15 * 0x10100 ^ 0xff00ffff;
      if ((int)uVar17 < 0) {
        local_cc.m_value = 0xff00ffff;
      }
      tcu::RGBA::toVec(&local_cc);
      local_a8.m_data[0] = local_70.lookupScale.m_data[0] * local_b8 + local_70.lookupBias.m_data[0]
      ;
      local_a8.m_data[1] =
           local_70.lookupScale.m_data[1] * fStack_b4 + local_70.lookupBias.m_data[1];
      local_a8.m_data[2] =
           local_70.lookupScale.m_data[2] * fStack_b0 + local_70.lookupBias.m_data[2];
      local_a8.m_data[3] =
           local_70.lookupScale.m_data[3] * fStack_ac + local_70.lookupBias.m_data[3];
      tcu::clear(&local_98,&local_a8);
      uVar15 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar15;
    } while (iVar18 + 1U != uVar15);
  }
  util::TextureRenderer::add3DTexture(local_c8,&this->m_texture);
  return;
}

Assistant:

Texture3DLodControlTestInstance::Texture3DLodControlTestInstance (Context& context, const Texture3DMipmapTestCaseParameters& testParameters)
	: TestInstance		(context)
	, m_texWidth		(32)
	, m_texHeight		(32)
	, m_texDepth		(32)
	, m_testParameters	(testParameters)
	, m_minFilter		(testParameters.minFilter)
	, m_texture			(DE_NULL)
	, m_renderer		(context, testParameters.sampleCount, m_texWidth*4, m_texHeight*4)
{
	const VkFormat			format		= VK_FORMAT_R8G8B8A8_UNORM;
	tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(mapVkFormat(format));
	const tcu::Vec4&		cScale		= fmtInfo.lookupScale;
	const tcu::Vec4&		cBias		= fmtInfo.lookupBias;
	const int				numLevels	= deLog2Floor32(de::max(de::max(m_texWidth, m_texHeight), m_texDepth))+1;

	m_texture = TestTexture3DSp(new pipeline::TestTexture3D(vk::mapVkFormat(format), m_texWidth, m_texHeight, m_texDepth));

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const deUint32	step	= 0xff / (numLevels-1);
		const deUint32	inc		= deClamp32(step*levelNdx, 0x00, 0xff);
		const deUint32	dec		= 0xff - inc;
		const deUint32	rgb		= (inc << 16) | (dec << 8) | 0xff;
		const deUint32	color	= 0xff000000 | rgb;

		tcu::clear(m_texture->getLevel(levelNdx, 0), tcu::RGBA(color).toVec()*cScale + cBias);
	}

	m_renderer.add3DTexture(m_texture);
}